

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O0

void Prn_gen<Blob<160>>(int nbRn,pfHash hash,vector<Blob<160>,_std::allocator<Blob<160>_>_> *hashes)

{
  code *in_RSI;
  int in_EDI;
  Blob<160> h;
  int i;
  Blob<160> hcopy;
  undefined1 local_44 [12];
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  int iVar1;
  undefined4 in_stack_ffffffffffffffd4;
  
  printf("Generating %i random numbers : \n");
  Blob<160>::Blob((Blob<160> *)&stack0xffffffffffffffd4);
  memset(&stack0xffffffffffffffd4,0,0x14);
  for (iVar1 = 0; iVar1 < in_EDI; iVar1 = iVar1 + 1) {
    Blob<160>::Blob((Blob<160> *)local_44);
    (*in_RSI)(&stack0xffffffffffffffd4,0x14,0,local_44);
    std::vector<Blob<160>,_std::allocator<Blob<160>_>_>::push_back
              ((vector<Blob<160>,_std::allocator<Blob<160>_>_> *)
               CONCAT44(in_stack_ffffffffffffffd4,iVar1),
               (value_type *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    in_stack_ffffffffffffffd4 = (undefined4)local_44._0_8_;
  }
  return;
}

Assistant:

void Prn_gen (int nbRn, pfHash hash, std::vector<hashtype> & hashes )
{
  assert(nbRn < 0);

  printf("Generating %i random numbers : \n", nbRn);

  hashtype hcopy;
  memset(&hcopy, 0, sizeof(hcopy));

  // a generated random number becomes the input for the next one
  for (int i=0; i< nbRn; i++) {
      hashtype h;
      hash(&hcopy, sizeof(hcopy), 0, &h);
      hashes.push_back(h);
      memcpy(&hcopy, &h, sizeof(h));
  }
}